

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorRefinementAmenability.cpp
# Opt level: O2

Labeling * __thiscall
ColorRefinementAmenability::ColorRefinementAmenability::compute_stable_coloring
          (Labeling *__return_storage_ptr__,ColorRefinementAmenability *this,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *node_colors,
          unordered_multimap<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
          *colors_to_nodes,
          unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          *node_to_color)

{
  ulong uVar1;
  pointer puVar2;
  int iVar3;
  uint v;
  Label *c;
  size_t __new_size;
  pointer puVar4;
  size_t sVar5;
  int iVar6;
  Node *n;
  pointer puVar7;
  ulong uVar8;
  int local_10c;
  Labels colors;
  Label new_color;
  Labels new_coloring;
  Labels coloring;
  Nodes neighbors;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  new_colors;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  __new_size = GraphLibrary::Graph::get_num_nodes(&this->m_graph);
  coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_colors._M_h._M_buckets = (__buckets_ptr)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&coloring,__new_size,(value_type_conflict2 *)&new_colors);
  new_colors._M_h._M_buckets = (__buckets_ptr)0x1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&new_coloring,__new_size,(value_type_conflict2 *)&new_colors);
  local_10c = -1;
  iVar6 = 1;
  while (iVar6 != local_10c) {
    new_colors._M_h._M_buckets = &new_colors._M_h._M_single_bucket;
    new_colors._M_h._M_bucket_count = 1;
    new_colors._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    new_colors._M_h._M_element_count = 0;
    new_colors._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    new_colors._M_h._M_rehash_policy._M_next_resize = 0;
    new_colors._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&coloring,&new_coloring);
    for (v = 0; uVar8 = (ulong)v, uVar8 < __new_size; v = v + 1) {
      colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GraphLibrary::Graph::get_neighbours
                ((Nodes *)&neighbors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ,&this->m_graph,v);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&colors,
                 ((long)neighbors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)neighbors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 2) + 1);
      puVar2 = neighbors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar7 = neighbors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1)
      {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&colors,
                   coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start + *puVar7);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&colors,
                 coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar8);
      new_color = colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1];
      colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      for (puVar4 = colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start;
          puVar4 != colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
        uVar1 = *puVar4;
        if (new_color < uVar1) {
          new_color = new_color + uVar1 * uVar1;
        }
        else {
          new_color = (new_color + 1) * new_color + uVar1;
        }
      }
      std::__detail::
      _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&new_colors,&new_color);
      new_coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = new_color;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&neighbors.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&colors);
    }
    iVar3 = (int)new_colors._M_h._M_element_count;
    if (iVar6 == (int)new_colors._M_h._M_element_count) {
      sVar5 = GraphLibrary::Graph::get_num_nodes(&this->m_graph);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::operator=(&node_colors->_M_h,&new_colors._M_h);
      for (uVar8 = 0; (sVar5 & 0xffffffff) != uVar8; uVar8 = uVar8 + 1) {
        colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)new_coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8];
        colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(colors.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,(int)uVar8);
        std::__detail::
        _Insert_base<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
        ::insert<std::pair<unsigned_long_const,unsigned_int>const*>
                  ((_Insert_base<unsigned_long,std::pair<unsigned_long_const,unsigned_int>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                    *)colors_to_nodes,(pair<const_unsigned_long,_unsigned_int> *)&colors,
                   (pair<const_unsigned_long,_unsigned_int> *)
                   &colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
        colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(colors.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,(int)uVar8);
        colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)new_coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar8];
        std::__detail::
        _Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::insert<std::pair<unsigned_int_const,unsigned_long>const*>
                  ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)node_to_color,(pair<const_unsigned_int,_unsigned_long> *)&colors,
                   (pair<const_unsigned_int,_unsigned_long> *)
                   &colors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
      }
    }
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&new_colors._M_h);
    local_10c = iVar6;
    iVar6 = iVar3;
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&new_coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&coloring.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return __return_storage_ptr__;
}

Assistant:

Labeling ColorRefinementAmenability::compute_stable_coloring(unordered_set<Label> &node_colors,
                                                                 unordered_multimap<Label, Node> &colors_to_nodes,
                                                                 unordered_map<Node, Label> &node_to_color) const {
        Labeling node_label;
        size_t num_nodes = m_graph.get_num_nodes();

        Labels coloring;
        Labels new_coloring;

        // Labels each node with the same label.
        coloring.resize(num_nodes, 0);
        new_coloring.resize(num_nodes, 1);
        uint num_old_colors = -1;
        uint num_new_colors = 1;

        while (num_new_colors != num_old_colors) {
            unordered_set<Label> new_colors;

            // Update coloring.
            coloring = new_coloring;
            num_old_colors = num_new_colors;

            // Iterate over all nodes.
            for (Node v = 0; v < num_nodes; ++v) {
                Labels colors;
                Nodes neighbors(m_graph.get_neighbours(v));
                colors.reserve(neighbors.size() + 1);

                // Get colors of neighbors.
                for (const Node &n: neighbors) {
                    colors.push_back(coloring[n]);
                }
                sort(colors.begin(), colors.end());
                colors.push_back(coloring[v]);

                // Compute new label using composition to bijectively map two integers to on integer.ŧ
                Label new_color = colors.back();
                colors.pop_back();
                for (const Label &c: colors) {
                    new_color = pairing(new_color, c);
                }

                new_colors.insert(new_color);
                new_coloring[v] = new_color;

            }

            num_new_colors = new_colors.size();
            if (num_new_colors == num_old_colors) {
                uint num_nodes = m_graph.get_num_nodes();

                node_colors = new_colors;

                for (Node i = 0; i < num_nodes; ++i) {
                    colors_to_nodes.insert({{new_coloring[i], i}});
                    node_to_color.insert({{i, new_coloring[i]}});
                }
            }

        }

        return node_label;
    }